

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

bool_t hexEqRev(void *buf,char *hex)

{
  size_t sVar1;
  byte bVar2;
  
  sVar1 = strLen(hex);
  bVar2 = 0;
  for (; sVar1 != 0; sVar1 = sVar1 - 2) {
    bVar2 = bVar2 | (hex_dec_table[(byte)hex[sVar1 - 2]] << 4 | hex_dec_table[(byte)hex[sVar1 - 1]])
                    ^ *buf;
    buf = (void *)((long)buf + 1);
  }
  return (bool_t)(bVar2 == 0);
}

Assistant:

bool_t SAFE(hexEqRev)(const void* buf, const char* hex)
{
	register word diff = 0;
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	hex = hex + count;
	for (; count; count -= 2, buf = (const octet*)buf + 1)
		diff |= *(const octet*)buf ^ hexToO(hex -= 2);
	return wordEq(diff, 0);
}